

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Matrix * operator+(Matrix *__return_storage_ptr__,Matrix *lhs,Matrix *rhs)

{
  int iVar1;
  int iVar2;
  invalid_argument *piVar3;
  Fraction *pFVar4;
  Fraction *b;
  Fraction FVar5;
  int local_38;
  int local_34;
  int j;
  int i;
  Matrix *rhs_local;
  Matrix *lhs_local;
  Matrix *result;
  
  iVar1 = Matrix::GetNumRows(lhs);
  iVar2 = Matrix::GetNumRows(rhs);
  if (iVar1 != iVar2) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"[SUM] Mismatched number of rows");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  iVar1 = Matrix::GetNumColumns(lhs);
  iVar2 = Matrix::GetNumColumns(rhs);
  if (iVar1 == iVar2) {
    iVar1 = Matrix::GetNumRows(lhs);
    iVar2 = Matrix::GetNumColumns(lhs);
    Matrix::Matrix(__return_storage_ptr__,iVar1,iVar2,0);
    for (local_34 = 0; iVar1 = Matrix::GetNumRows(__return_storage_ptr__), local_34 < iVar1;
        local_34 = local_34 + 1) {
      for (local_38 = 0; iVar1 = Matrix::GetNumColumns(__return_storage_ptr__), local_38 < iVar1;
          local_38 = local_38 + 1) {
        pFVar4 = Matrix::At(lhs,local_34,local_38);
        b = Matrix::At(rhs,local_34,local_38);
        FVar5 = operator+(pFVar4,b);
        pFVar4 = Matrix::At(__return_storage_ptr__,local_34,local_38);
        *pFVar4 = FVar5;
      }
    }
    return __return_storage_ptr__;
  }
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar3,"[SUM] Mismatched number of columns");
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Matrix operator+(const Matrix& lhs, const Matrix& rhs) {
  if (lhs.GetNumRows() != rhs.GetNumRows()) {
    throw std::invalid_argument("[SUM] Mismatched number of rows");
  }

  if (lhs.GetNumColumns() != rhs.GetNumColumns()) {
    throw std::invalid_argument("[SUM] Mismatched number of columns");
  }

  Matrix result(lhs.GetNumRows(), lhs.GetNumColumns());
  for (int i = 0; i < result.GetNumRows(); ++i) {
    for (int j = 0; j < result.GetNumColumns(); ++j) {
      result.At(i, j) = lhs.At(i, j) + rhs.At(i, j);
    }
  }

  return result;
}